

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vtk.cpp
# Opt level: O3

void Omega_h::vtk::write_vtkfile_vtu_start_tag(ostream *stream,bool compress)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"<VTKFile type=\"UnstructuredGrid\" byte_order=\"",0x2d);
  bVar1 = is_little_endian_cpu();
  if (bVar1) {
    pcVar3 = "LittleEndian";
    lVar2 = 0xc;
  }
  else {
    pcVar3 = "BigEndian";
    lVar2 = 9;
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar3,lVar2);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\" header_type=\"",0xf);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"UInt64",6);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\"",1);
  if (compress) {
    std::__ostream_insert<char,std::char_traits<char>>
              (stream," compressor=\"vtkZLibDataCompressor\"",0x23);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,">\n",2);
  return;
}

Assistant:

void write_vtkfile_vtu_start_tag(std::ostream& stream, bool compress) {
  stream << "<VTKFile type=\"UnstructuredGrid\" byte_order=\"";
  if (is_little_endian_cpu())
    stream << "LittleEndian";
  else
    stream << "BigEndian";
  stream << "\" header_type=\"";
  stream << Traits<std::uint64_t>::name();
  stream << "\"";
#ifdef OMEGA_H_USE_ZLIB
  if (compress) {
    stream << " compressor=\"vtkZLibDataCompressor\"";
  }
#else
  OMEGA_H_CHECK(!compress);
#endif
  stream << ">\n";
}